

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  ulong __n;
  reference pvVar1;
  float fVar2;
  float fVar3;
  float z_;
  float w_;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  PositionColorVertex local_b4;
  uint local_94;
  allocator<vkt::Draw::PositionColorVertex> local_8d;
  deUint32 vertexIdx;
  Vector<float,_4> local_70;
  PositionColorVertex local_60;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_40;
  uint local_24;
  undefined1 local_20 [4];
  deUint32 vectorSize;
  Random rnd;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,
                     *(uint *)&(this->m_data).field_0x24 ^
                     *(uint *)&(this->m_data).super_DrawParamsBase.field_0x1c ^ 0xc2a39f);
  local_24 = *(int *)&(this->m_data).field_0x24 +
             *(int *)&(this->m_data).super_DrawParamsBase.field_0x1c;
  __n = (ulong)local_24;
  tcu::Vector<float,_4>::Vector(&local_70,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vertexIdx,0.0,0.0,0.0,0.0);
  PositionColorVertex::PositionColorVertex(&local_60,&local_70,(Vec4 *)&vertexIdx);
  std::allocator<vkt::Draw::PositionColorVertex>::allocator(&local_8d);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector(&local_40,__n,&local_60,&local_8d);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  operator=((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             *)&this->m_data,&local_40);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  ~vector(&local_40);
  std::allocator<vkt::Draw::PositionColorVertex>::~allocator(&local_8d);
  for (local_94 = *(uint *)&(this->m_data).field_0x24; local_94 < local_24; local_94 = local_94 + 1)
  {
    fVar2 = de::Random::getFloat((Random *)local_20,-1.0,1.0);
    fVar3 = de::Random::getFloat((Random *)local_20,-1.0,1.0);
    tcu::Vector<float,_4>::Vector(&local_c4,fVar2,fVar3,1.0,1.0);
    fVar2 = de::Random::getFloat((Random *)local_20,0.0,1.0);
    fVar3 = de::Random::getFloat((Random *)local_20,0.0,1.0);
    z_ = de::Random::getFloat((Random *)local_20,0.0,1.0);
    w_ = de::Random::getFloat((Random *)local_20,0.0,1.0);
    tcu::Vector<float,_4>::Vector(&local_d4,fVar2,fVar3,z_,w_);
    PositionColorVertex::PositionColorVertex(&local_b4,&local_c4,&local_d4);
    pvVar1 = std::
             vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             ::operator[]((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                           *)&this->m_data,(ulong)local_94);
    *(undefined8 *)(pvVar1->position).m_data = local_b4.position.m_data._0_8_;
    *(undefined8 *)((pvVar1->position).m_data + 2) = local_b4.position.m_data._8_8_;
    *(undefined8 *)(pvVar1->color).m_data = local_b4.color.m_data._0_8_;
    *(undefined8 *)((pvVar1->color).m_data + 2) = local_b4.color.m_data._8_8_;
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void DrawTestInstance<DrawParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.params.firstVertex ^ m_data.params.vertexCount);

	const deUint32	vectorSize	= m_data.params.firstVertex + m_data.params.vertexCount;

	// Initialize the vector
	m_data.vertices = std::vector<PositionColorVertex>(vectorSize, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Fill only the used indexes
	for (deUint32 vertexIdx = m_data.params.firstVertex; vertexIdx < vectorSize; ++vertexIdx)
	{
		m_data.vertices[vertexIdx] = PositionColorVertex(
			tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0),										// Coord
			tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0)));	// Color
	}
}